

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::mid(QString *this,qsizetype position,qsizetype n)

{
  CutResult CVar1;
  qsizetype originalLength;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype l;
  qsizetype p;
  QString *this_00;
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  originalLength = size(in_RSI);
  CVar1 = QtPrivate::QContainerImplHelper::mid(originalLength,&local_10,&local_18);
  switch((QString *)(ulong)CVar1) {
  case (QString *)0x0:
    QString((QString *)0x511926);
    break;
  case (QString *)0x1:
    resize(this_00,(qsizetype)in_RDI);
  case (QString *)0x2:
    QString(this_00,in_RDI);
    break;
  case (QString *)0x3:
    sliced((QString *)(ulong)CVar1,(qsizetype)in_RSI,(qsizetype)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QString QString::mid(qsizetype position, qsizetype n) &&
{
    qsizetype p = position;
    qsizetype l = n;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(size(), &p, &l)) {
    case QContainerImplHelper::Null:
        return QString();
    case QContainerImplHelper::Empty:
        resize(0);      // keep capacity if we've reserve()d
        [[fallthrough]];
    case QContainerImplHelper::Full:
        return std::move(*this);
    case QContainerImplHelper::Subset:
        return std::move(*this).sliced(p, l);
    }
    Q_UNREACHABLE_RETURN(QString());
}